

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

wchar_t format_numeric_keypad_key(char *buf,Terminal *term,char key,_Bool shift,_Bool ctrl)

{
  wchar_t wVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  byte bVar7;
  int iVar8;
  char *__format;
  byte bVar9;
  
  if (term->app_keypad_keys == true) {
    bVar7 = term->no_applic_k ^ 1;
  }
  else {
    bVar7 = 0;
  }
  iVar8 = (int)buf;
  if (((byte)(key - 0x31U) < 9) && (term->nethack_keypad != false)) {
    uVar3 = (byte)key - 0x31;
    bVar7 = "bjnh.lyku"[uVar3];
    bVar9 = bVar7 - 0x20;
    if (!shift) {
      bVar9 = bVar7;
    }
    if (uVar3 == 4) {
      bVar9 = bVar7;
    }
    bVar7 = bVar7 & 0x1f;
    if (!ctrl) {
      bVar7 = bVar9;
    }
    if (uVar3 == 4) {
      bVar7 = bVar9;
    }
    *buf = bVar7;
    iVar5 = iVar8 + 1;
    goto LAB_0010fdf8;
  }
  wVar1 = term->funky_type;
  uVar3 = 0;
  bVar2 = true;
  iVar4 = (int)key;
  if ((wVar1 == L'\x03') || ((wVar1 < L'\x02' & bVar7) != 0)) {
    if (iVar4 < 0x2f) {
      if (iVar4 == 0x2a) {
        uVar3 = 0x52;
      }
      else {
        if (iVar4 != 0x2d) goto LAB_0010fd78;
        uVar3 = 0x53;
      }
    }
    else if (iVar4 == 0x2f) {
      uVar3 = 0x51;
    }
    else {
      if (iVar4 != 0x47) goto LAB_0010fd78;
      uVar3 = 0x50;
    }
    bVar2 = false;
  }
LAB_0010fd78:
  iVar5 = iVar8;
  if (bVar7 == 0) {
switchD_0010fd95_caseD_2c:
    if (bVar2) goto LAB_0010fdf8;
    goto LAB_0010fdbd;
  }
  switch(iVar4) {
  case 0x2a:
    uVar6 = 0x6a;
    goto LAB_0010fe39;
  case 0x2b:
    if (wVar1 == L'\x02') {
      uVar3 = shift + 0x6b;
    }
    else {
      uVar3 = shift | 0x6c;
    }
    break;
  case 0x2c:
    goto switchD_0010fd95_caseD_2c;
  case 0x2d:
    uVar6 = 0x6d;
    goto LAB_0010fe39;
  case 0x2e:
    uVar3 = 0x6e;
    break;
  case 0x2f:
    uVar6 = 0x6f;
LAB_0010fe39:
    if (wVar1 == L'\x02') {
      uVar3 = uVar6;
    }
    if ((bool)(wVar1 != L'\x02' & bVar2)) goto LAB_0010fdf8;
    break;
  case 0x30:
    uVar3 = 0x70;
    break;
  case 0x31:
    uVar3 = 0x71;
    break;
  case 0x32:
    uVar3 = 0x72;
    break;
  case 0x33:
    uVar3 = 0x73;
    break;
  case 0x34:
    uVar3 = 0x74;
    break;
  case 0x35:
    uVar3 = 0x75;
    break;
  case 0x36:
    uVar3 = 0x76;
    break;
  case 0x37:
    uVar3 = 0x77;
    break;
  case 0x38:
    uVar3 = 0x78;
    break;
  case 0x39:
    uVar3 = 0x79;
    break;
  default:
    if (iVar4 != 0xd) goto switchD_0010fd95_caseD_2c;
    uVar3 = 0x4d;
  }
LAB_0010fdbd:
  if (term->vt52_mode == true) {
    if ((uVar3 & 0xfffffffc) == 0x50) {
      __format = "\x1b%c";
    }
    else {
      __format = "\x1b?%c";
    }
  }
  else {
    __format = "\x1bO%c";
  }
  iVar5 = sprintf(buf,__format);
  iVar5 = iVar5 + iVar8;
LAB_0010fdf8:
  return iVar5 - iVar8;
}

Assistant:

int format_numeric_keypad_key(char *buf, Terminal *term, char key,
                              bool shift, bool ctrl)
{
    char *p = buf;
    bool app_keypad = (term->app_keypad_keys && !term->no_applic_k);

    if (term->nethack_keypad && (key >= '1' && key <= '9')) {
        static const char nh_base[] = "bjnh.lyku";
        char c = nh_base[key - '1'];
        if (ctrl && c != '.')
            c &= 0x1F;
        else if (shift && c != '.')
            c += 'A'-'a';
        *p++ = c;
    } else {
        int xkey = 0;

        if (term->funky_type == FUNKY_VT400 ||
            (term->funky_type <= FUNKY_LINUX && app_keypad)) {
            switch (key) {
              case 'G': xkey = 'P'; break;
              case '/': xkey = 'Q'; break;
              case '*': xkey = 'R'; break;
              case '-': xkey = 'S'; break;
            }
        }

        if (app_keypad) {
            switch (key) {
              case '0': xkey = 'p'; break;
              case '1': xkey = 'q'; break;
              case '2': xkey = 'r'; break;
              case '3': xkey = 's'; break;
              case '4': xkey = 't'; break;
              case '5': xkey = 'u'; break;
              case '6': xkey = 'v'; break;
              case '7': xkey = 'w'; break;
              case '8': xkey = 'x'; break;
              case '9': xkey = 'y'; break;
              case '.': xkey = 'n'; break;
              case '\r': xkey = 'M'; break;

              case '+':
                /*
                 * Keypad + is tricky. It covers a space that would
                 * be taken up on the VT100 by _two_ keys; so we
                 * let Shift select between the two. Worse still,
                 * in xterm function key mode we change which two...
                 */
                if (term->funky_type == FUNKY_XTERM)
                    xkey = shift ? 'l' : 'k';
                else
                    xkey = shift ? 'm' : 'l';
                break;

              case '/':
                if (term->funky_type == FUNKY_XTERM)
                    xkey = 'o';
                break;
              case '*':
                if (term->funky_type == FUNKY_XTERM)
                    xkey = 'j';
                break;
              case '-':
                if (term->funky_type == FUNKY_XTERM)
                    xkey = 'm';
                break;
            }
        }

        if (xkey) {
            if (term->vt52_mode) {
                if (xkey >= 'P' && xkey <= 'S')
                    p += sprintf(p, "\x1B%c", xkey);
                else
                    p += sprintf(p, "\x1B?%c", xkey);
            } else
                p += sprintf(p, "\x1BO%c", xkey);
        }
    }

    return p - buf;
}